

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkSensitivityMiter(Abc_Ntk_t *pNtk,int iVar)

{
  Abc_Aig_t *pAVar1;
  uint __line;
  Vec_Ptr_t *__ptr;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  int iVar8;
  Abc_Obj_t *local_48;
  Abc_Ntk_t *local_40;
  Vec_Ptr_t *local_38;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (iVar < pNtk->vCis->nSize) {
      pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
      pcVar3 = Extra_UtilStrsav(pNtk->pName);
      pNtk_00->pName = pcVar3;
      pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
      pNtk_00->pSpec = pcVar3;
      Abc_NtkCleanCopy(pNtk);
      pAVar4 = Abc_AigConst1(pNtk_00);
      pAVar5 = Abc_AigConst1(pNtk);
      (pAVar5->field_6).pCopy = pAVar4;
      pAVar4 = Abc_AigConst1(pNtk_00);
      pAVar5 = Abc_AigConst1(pNtk);
      (pAVar5->field_5).pData = pAVar4;
      for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = Abc_NtkCi(pNtk,iVar8);
        pAVar5 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
        (pAVar4->field_6).pCopy = pAVar5;
        (pAVar4->field_5).pData = pAVar5;
      }
      Abc_NtkAddDummyPiNames(pNtk_00);
      pAVar4 = Abc_NtkCi(pNtk,iVar);
      local_48 = pAVar4;
      pAVar5 = Abc_AigConst1(pNtk_00);
      (pAVar4->field_6).pTemp = (void *)((ulong)pAVar5 ^ 1);
      pAVar5 = Abc_AigConst1(pNtk_00);
      (pAVar4->field_5).pData = pAVar5;
      local_40 = pNtk;
      local_38 = Abc_NtkDfsReverseNodes(pNtk,&local_48,1);
      for (iVar8 = 0; __ptr = local_38, iVar8 < local_38->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(local_38,iVar8);
        if (pAVar4 != (Abc_Obj_t *)0x0) goto LAB_002c1c6f;
        pAVar5 = (Abc_Obj_t *)0x0;
        local_48 = pAVar4;
        while (pAVar4 = pAVar5, local_48 != (Abc_Obj_t *)0x0) {
          pAVar5 = (Abc_Obj_t *)local_48->pNtk->vObjs->pArray[*(local_48->vFanins).pArray];
          iVar2 = Abc_NodeIsTravIdCurrent(pAVar5);
          if (iVar2 == 0) {
            pAVar6 = Abc_NtkSensitivityMiter_rec(pNtk_00,pAVar5);
            (pAVar5->field_5).pData = pAVar6;
          }
          pAVar5 = (Abc_Obj_t *)local_48->pNtk->vObjs->pArray[(local_48->vFanins).pArray[1]];
          iVar2 = Abc_NodeIsTravIdCurrent(pAVar5);
          if (iVar2 == 0) {
            pAVar6 = Abc_NtkSensitivityMiter_rec(pNtk_00,pAVar5);
            (pAVar5->field_5).pData = pAVar6;
          }
          pAVar5 = local_48;
          pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
          pAVar6 = Abc_ObjChild0Copy(local_48);
          pAVar5 = Abc_ObjChild1Copy(pAVar5);
          pAVar6 = Abc_AigAnd(pAVar1,pAVar6,pAVar5);
          pAVar5 = local_48;
          (local_48->field_6).pCopy = pAVar6;
          pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
          pAVar6 = Abc_ObjChild0Data(local_48);
          pAVar5 = Abc_AigAnd(pAVar1,pAVar6,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)&pAVar5->field_0x14 >> 0xb & 1) ^
                              *(ulong *)((long)pAVar5->pNtk->vObjs->pArray
                                               [(pAVar5->vFanins).pArray[1]] + 0x38)));
          (local_48->field_5).pData = pAVar5;
          pAVar5 = (Abc_Obj_t *)0x0;
          local_48 = pAVar4;
          if (pAVar4 != (Abc_Obj_t *)0x0) {
LAB_002c1c6f:
            pAVar5 = (pAVar4->field_6).pCopy;
            local_48 = pAVar4;
          }
        }
      }
      free(local_38->pArray);
      free(__ptr);
      pAVar4 = Abc_AigConst1(pNtk_00);
      pAVar4 = (Abc_Obj_t *)((ulong)pAVar4 ^ 1);
      pAVar7 = local_40;
      for (iVar8 = 0; iVar8 < pAVar7->vCos->nSize; iVar8 = iVar8 + 1) {
        local_48 = (Abc_Obj_t *)Vec_PtrEntry(pAVar7->vCos,iVar8);
        iVar2 = Abc_NodeIsTravIdCurrent(local_48);
        pAVar5 = local_48;
        if (iVar2 != 0) {
          pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
          if (iVar8 == pAVar7->vCos->nSize + -1) {
            pAVar5 = Abc_ObjChild0Data(local_48);
            pAVar4 = Abc_AigAnd(pAVar1,pAVar4,pAVar5);
            pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
            pAVar5 = Abc_ObjChild0Copy(local_48);
            pAVar4 = Abc_AigAnd(pAVar1,pAVar4,pAVar5);
            pAVar7 = local_40;
          }
          else {
            pAVar6 = Abc_ObjChild0Copy(local_48);
            pAVar5 = Abc_ObjChild0Data(pAVar5);
            pAVar5 = Abc_AigXor(pAVar1,pAVar6,pAVar5);
            pAVar4 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar4,pAVar5);
            pAVar7 = local_40;
          }
        }
      }
      pAVar5 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar5,pAVar4);
      Abc_ObjAssignName(pAVar5,"miter",(char *)0x0);
      iVar8 = Abc_NtkCheck(pNtk_00);
      if (iVar8 == 0) {
        puts("Abc_NtkSensitivityMiter: The network check has failed.");
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = (Abc_Ntk_t *)0x0;
      }
      return pNtk_00;
    }
    pcVar3 = "iVar < Abc_NtkCiNum(pNtk)";
    __line = 0x4a;
  }
  else {
    pcVar3 = "Abc_NtkIsStrash(pNtk)";
    __line = 0x49;
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSense.c"
                ,__line,"Abc_Ntk_t *Abc_NtkSensitivityMiter(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSensitivityMiter( Abc_Ntk_t * pNtk, int iVar )
{
    Abc_Ntk_t * pMiter;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext, * pFanin, * pOutput, * pObjNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( iVar < Abc_NtkCiNum(pNtk) );

    // duplicate the network
    pMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pMiter->pName = Extra_UtilStrsav(pNtk->pName);
    pMiter->pSpec = Extra_UtilStrsav(pNtk->pSpec);

    // assign the PIs
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pMiter);
    Abc_AigConst1(pNtk)->pData = Abc_AigConst1(pMiter);
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi( pMiter );
        pObj->pData = pObj->pCopy;
    }
    Abc_NtkAddDummyPiNames( pMiter );

    // assign the cofactors of the CI node to be constants
    pObj = Abc_NtkCi( pNtk, iVar );
    pObj->pCopy = Abc_ObjNot( Abc_AigConst1(pMiter) ); 
    pObj->pData = Abc_AigConst1(pMiter); 

    // collect the internal nodes
    vNodes = Abc_NtkDfsReverseNodes( pNtk, &pObj, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        for ( pNext = pObj? pObj->pCopy : pObj; pObj; pObj = pNext, pNext = pObj? pObj->pCopy : pObj )
        {
            pFanin = Abc_ObjFanin0(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                pFanin->pData = Abc_NtkSensitivityMiter_rec( pMiter, pFanin );
            pFanin = Abc_ObjFanin1(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                pFanin->pData = Abc_NtkSensitivityMiter_rec( pMiter, pFanin );
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Data(pObj), Abc_ObjChild1Data(pObj) );
        }
    }
    Vec_PtrFree( vNodes );

    // update the affected COs
    pOutput = Abc_ObjNot( Abc_AigConst1(pMiter) ); 
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        // get the result of quantification
        if ( i == Abc_NtkCoNum(pNtk) - 1 )
        {
            pOutput = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, pOutput, Abc_ObjChild0Data(pObj) );
            pOutput = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, pOutput, Abc_ObjChild0Copy(pObj) );
        }
        else
        {
            pNext   = Abc_AigXor( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
            pOutput = Abc_AigOr( (Abc_Aig_t *)pMiter->pManFunc, pOutput, pNext );
        }
    }
    // add the PO node and name
    pObjNew = Abc_NtkCreatePo(pMiter);
    Abc_ObjAddFanin( pObjNew, pOutput );
    Abc_ObjAssignName( pObjNew, "miter", NULL );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pMiter ) )
    {
        printf( "Abc_NtkSensitivityMiter: The network check has failed.\n" );
        Abc_NtkDelete( pMiter );
        return NULL;
    }
    return pMiter;
}